

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_priority_deque.cpp
# Opt level: O0

void __thiscall
priority_deque_range_constructor_clear::test_method(priority_deque_range_constructor_clear *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_1e8;
  basic_cstring<const_char> local_1d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1c8;
  undefined1 local_1a3;
  bool local_1a2;
  value_expr<bool> local_1a1;
  assertion_result local_1a0;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  basic_cstring<const_char> local_168;
  basic_cstring<const_char> local_158;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_148;
  multiset<int,_std::less<int>,_std::allocator<int>_> local_128;
  undefined1 local_f3;
  bool local_f2;
  value_expr<bool> local_f1;
  assertion_result local_f0;
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8;
  vector<int,_std::allocator<int>_> local_b8;
  less<int> local_91;
  _Rb_tree_const_iterator<int> local_90;
  _Rb_tree_const_iterator<int> local_88;
  undefined1 local_80 [8];
  priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> pd;
  int local_48;
  int local_44;
  undefined1 local_40 [4];
  int i;
  multiset<int,_std::less<int>,_std::allocator<int>_> existing_elements;
  priority_deque_range_constructor_clear *this_local;
  
  existing_elements._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::multiset<int,_std::less<int>,_std::allocator<int>_>::multiset
            ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40);
  for (local_44 = 0; local_44 < 0x200; local_44 = local_44 + 1) {
    local_48 = rand();
    pd._24_8_ = std::multiset<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40,&local_48
                          );
  }
  local_88._M_node =
       (_Base_ptr)
       std::multiset<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40);
  local_90._M_node =
       (_Base_ptr)
       std::multiset<int,_std::less<int>,_std::allocator<int>_>::end
                 ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40);
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_b8);
  boost::container::priority_deque<int,std::vector<int,std::allocator<int>>,std::less<int>>::
  priority_deque<std::_Rb_tree_const_iterator<int>>
            ((priority_deque<int,std::vector<int,std::allocator<int>>,std::less<int>> *)local_80,
             local_88,local_90,&local_91,&local_b8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_b8);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_c8,0x134,&local_d8);
    std::multiset<int,_std::less<int>,_std::allocator<int>_>::multiset
              (&local_128,(multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40);
    local_f3 = (anonymous_namespace)::
               have_same_elements<boost::container::priority_deque<int,std::vector<int,std::allocator<int>>,std::less<int>>,int>
                         ((priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>
                           *)local_80,&local_128);
    boost::test_tools::assertion::seed::operator->*((seed *)&local_f1,&local_f2);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_f0,&local_f1,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,"have_same_elements(pd, existing_elements)",0x29);
    boost::unit_test::operator<<(&local_148,plVar3,&local_158);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_168,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion
              (&local_f0,&local_148.super_lazy_ostream,&local_168,0x134,REQUIRE,
               CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_148);
    boost::test_tools::assertion_result::~assertion_result(&local_f0);
    std::multiset<int,_std::less<int>,_std::allocator<int>_>::~multiset(&local_128);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  boost::container::priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>::
  clear((priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *)local_80);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_188);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_178,0x136,&local_188);
    local_1a3 = boost::container::
                priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>::empty
                          ((priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>
                            *)local_80);
    boost::test_tools::assertion::seed::operator->*((seed *)&local_1a1,&local_1a2);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_1a0,&local_1a1,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,"pd.empty()",10);
    boost::unit_test::operator<<(&local_1c8,plVar3,&local_1d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nmcclatchey[P]Priority-Deque/tests/test_priority_deque.cpp"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion
              (&local_1a0,&local_1c8.super_lazy_ostream,&local_1e8,0x136,REQUIRE,
               CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1c8);
    boost::test_tools::assertion_result::~assertion_result(&local_1a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  boost::container::priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_>::
  ~priority_deque((priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *)
                  local_80);
  std::multiset<int,_std::less<int>,_std::allocator<int>_>::~multiset
            ((multiset<int,_std::less<int>,_std::allocator<int>_> *)local_40);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( priority_deque_range_constructor_clear )
{
  using namespace boost::container;

  std::multiset<int> existing_elements;
  for (int i = 0; i < 512; ++i)
    existing_elements.insert(rand());
  priority_deque<int> pd ( existing_elements.begin(), existing_elements.end() );

  BOOST_TEST_REQUIRE(have_same_elements(pd, existing_elements));
  pd.clear();
  BOOST_TEST_REQUIRE(pd.empty());
}